

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::clearEmptySegments(string *unit)

{
  const_iterator this;
  const_iterator __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  reference pvVar2;
  size_type in_RDI;
  size_type fnd;
  value_type *seg;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  *__range1;
  bool changed;
  size_type in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  bool local_9;
  
  local_9 = false;
  this = std::
         array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
         ::begin((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                  *)0x6d4576);
  __str = std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
          ::end((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                 *)0x6d4587);
LAB_006d458c:
  if (this == __str) {
    return local_9;
  }
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str,
                (size_type)this);
LAB_006d45be:
  do {
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  0xffffffffffffffff) break;
    if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (*pvVar2 == '\\') {
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                           (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__str,(size_type)this);
        goto LAB_006d45be;
      }
    }
    in_stack_ffffffffffffffc0 = pbVar1;
    in_stack_ffffffffffffffb8 = in_RDI;
    pbVar1 = in_stack_ffffffffffffffc0;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (size_type)pbVar1,(size_type)in_stack_ffffffffffffffc0);
    local_9 = true;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str
                  ,(size_type)this);
  } while( true );
  this = (const_iterator)(this_00 + 1);
  goto LAB_006d458c;
}

Assistant:

bool clearEmptySegments(std::string& unit)
{
    bool changed = false;
    for (const auto& seg : Esegs) {
        auto fnd = unit.find(seg);
        while (fnd != std::string::npos) {
            if (fnd > 0 && unit[fnd - 1] == '\\') {
                fnd = unit.find(seg, fnd + 2);
                continue;
            }
            unit.erase(fnd, seg.size());
            changed = true;
            fnd = unit.find(seg, fnd + 1);
        }
    }
    return changed;
}